

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

int nni_getopt(nni_option *opts,char *nm,void *arg,void *buf,size_t *szp,nni_type otype)

{
  int iVar1;
  _func_int_void_ptr_void_ptr_size_t_ptr_nni_type **pp_Var2;
  
  pp_Var2 = &opts->o_get;
  while( true ) {
    if (((nni_option *)(pp_Var2 + -1))->o_name == (char *)0x0) {
      return 9;
    }
    iVar1 = strcmp(((nni_option *)(pp_Var2 + -1))->o_name,nm);
    if (iVar1 == 0) break;
    pp_Var2 = pp_Var2 + 3;
  }
  if (*pp_Var2 == (_func_int_void_ptr_void_ptr_size_t_ptr_nni_type *)0x0) {
    return 0x19;
  }
  iVar1 = (**pp_Var2)(arg,buf,szp,otype);
  return iVar1;
}

Assistant:

int
nni_getopt(const nni_option *opts, const char *nm, void *arg, void *buf,
    size_t *szp, nni_type otype)
{
	while (opts->o_name != NULL) {
		if (strcmp(opts->o_name, nm) == 0) {
			if (opts->o_get == NULL) {
				return (NNG_EWRITEONLY);
			}
			return (opts->o_get(arg, buf, szp, otype));
		}
		opts++;
	}
	return (NNG_ENOTSUP);
}